

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
ModbusSimulationDataGenerator::SendReadFIFOQueueRequest
          (ModbusSimulationDataGenerator *this,U8 DeviceID,U16 FIFOAddress)

{
  int iVar1;
  char cVar2;
  U16 UVar3;
  ushort uVar4;
  U16 LRCvalue;
  U16 CRCValue;
  U16 FIFOAddress_local;
  U8 DeviceID_local;
  ModbusSimulationDataGenerator *this_local;
  
  iVar1 = (int)this;
  if (this->mSettings->mModbusMode == ModbusRTUClient) {
    CreateModbusByte(this,(ulong)DeviceID);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,0x18);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)(int)(FIFOAddress & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)((int)(FIFOAddress & 0xff00) >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    UVar3 = update_CRC(this,0xffff,DeviceID);
    UVar3 = update_CRC(this,UVar3,'\x18');
    UVar3 = update_CRC(this,UVar3,(U8)FIFOAddress);
    UVar3 = update_CRC(this,UVar3,(U8)(FIFOAddress >> 8));
    CreateModbusByte(this,(long)(int)(UVar3 & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,(long)((int)(UVar3 & 0xff00) >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
  }
  else {
    uVar4 = (DeviceID + 0x18 + (FIFOAddress & 0xff) + (FIFOAddress >> 8) ^ 0xffff) + 1;
    CreateModbusByte(this,0x3a);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(uint)DeviceID >> 4));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,DeviceID & 0xf);
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,0x31);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,0x38);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(FIFOAddress & 0xf000) >> 0xc));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((FIFOAddress & 0xf0f) >> 8));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)(FIFOAddress & 0xf0) >> 4));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)(FIFOAddress & 0xf0f));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(U8)((int)((uVar4 & 0xff) & 0xf0) >> 4));
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    cVar2 = BinToLATIN1(this,(byte)uVar4 & 0xf);
    CreateModbusByte(this,(long)cVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,0xd);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
    CreateModbusByte(this,10);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(iVar1 + 0x30);
  }
  return;
}

Assistant:

void ModbusSimulationDataGenerator::SendReadFIFOQueueRequest( U8 DeviceID, U16 FIFOAddress )
{
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUClient )
    {
        CreateModbusByte( DeviceID );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( 0x18 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( FIFOAddress & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( FIFOAddress & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        U16 CRCValue = 0xFFFF; // Modbus/RTU uses CRC-16, calls for initialization to 0xFFFF
        CRCValue = update_CRC( CRCValue, DeviceID );
        CRCValue = update_CRC( CRCValue, 0x18 );
        CRCValue = update_CRC( CRCValue, FIFOAddress & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( FIFOAddress & 0xFF00 ) >> 8 );

        CreateModbusByte( ( CRCValue & 0x00FF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ( CRCValue & 0xFF00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
    }
    else
    {
        // it's easier to compute the LRC before converting the data from binary to ASCII
        U16 LRCvalue = 0x00; // Modbus/ASCII uses LRC, initialization to 0x00;

        LRCvalue = LRCvalue + DeviceID;
        LRCvalue = LRCvalue + 0x18;
        LRCvalue = LRCvalue + ( FIFOAddress & 0x00FF );
        LRCvalue = LRCvalue + ( ( FIFOAddress & 0xFF00 ) >> 8 );

        LRCvalue = ~LRCvalue + 1;
        LRCvalue = LRCvalue & 0x00FF;

        CreateModbusByte( ':' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '1' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '8' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( FIFOAddress & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( FIFOAddress & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( FIFOAddress & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( FIFOAddress & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF ) ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '\r' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( '\n' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
    }
}